

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O1

double YPSpur_md_get_pos(YPSpur *spur,int cs,double *x,double *y,double *theta)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_58;
  
  local_58.msg_type = 1;
  local_58.pid = (long)spur->pid;
  local_58.type = 0x70;
  local_58.cs = cs;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_58);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_58), -1 < iVar1)) {
    *x = local_58.data[0];
    *y = local_58.data[1];
    *theta = local_58.data[2];
    return local_58.data[3];
  }
  spur->connection_error = 1;
  return -1.0;
}

Assistant:

double YPSpur_md_get_pos(YPSpur* spur, int cs, double* x, double* y, double* theta)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_POS;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *x = msg.data[0];
  *y = msg.data[1];
  *theta = msg.data[2];
  time = msg.data[3];
  return time;
}